

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrome_trace_converter.cpp
# Opt level: O2

void __thiscall
HawkTracer::client::ChromeTraceConverter::process_event(ChromeTraceConverter *this,Event *event)

{
  bool bVar1;
  ostream *poVar2;
  Event *event_00;
  string label;
  allocator local_a6;
  allocator local_a5;
  uint local_a4;
  string local_a0;
  string local_80;
  unsigned_long local_60;
  string local_58;
  string local_38;
  
  Converter::_get_label_abi_cxx11_(&local_38,&this->super_Converter,event);
  bVar1 = std::operator==(&local_38,"");
  if (!bVar1) {
    if (this->_first_event_saved == true) {
      std::operator<<((ostream *)&this->_file,",");
    }
    else {
      this->_first_event_saved = true;
    }
    poVar2 = std::operator<<((ostream *)&this->_file,"{\"name\": \"");
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    poVar2 = std::operator<<(poVar2,"\", \"ph\": \"X\", \"ts\": ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", \"dur\": ");
    std::__cxx11::string::string((string *)&local_58,"duration",&local_a5);
    local_60 = 0;
    parser::Event::get_value_or_default<unsigned_long>(event,&local_58,&local_60);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", \"pid\": 0, \"tid\": ");
    std::__cxx11::string::string((string *)&local_80,"thread_id",&local_a6);
    local_a4 = 0;
    parser::Event::get_value_or_default<unsigned_int>(event,&local_80,&local_a4);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", \"args\": {");
    _get_args_abi_cxx11_(&local_a0,(ChromeTraceConverter *)event,event_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_a0);
    poVar2 = std::operator<<(poVar2,"}");
    std::operator<<(poVar2,"}");
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void ChromeTraceConverter::process_event(const parser::Event& event)
{
    std::string label = _get_label(event);

    if (label == "")
    {
        return;
    }

    if (_first_event_saved)
    {
        _file << ",";
    }
    else
    {
        _first_event_saved = true;
    }

    // Chrome expects the timestamps/durations to be microseconds
    // so we need to convert from nano to micro
    _file << "{\"name\": \"" << label
         << "\", \"ph\": \"X\", \"ts\": " << ns_to_ms(event.get_timestamp())
         << ", \"dur\": " << ns_to_ms(event.get_value_or_default<HT_DurationNs>("duration", 0u))
         << ", \"pid\": 0, \"tid\": " << event.get_value_or_default<HT_ThreadId>("thread_id", 0u)
         << ", \"args\": {" << _get_args(event) << "}"
         << "}";
}